

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

ShaderProgram *
deqp::gls::anon_unknown_1::createRenderProgram(RenderContext *renderContext,RenderBits renderBits)

{
  ContextType type;
  GLSLVersion glslVersion_00;
  ShaderProgram *this;
  RenderBits in_EDX;
  RenderBits renderBits_00;
  ProgramSources local_188;
  ShaderProgram *local_b8;
  ShaderProgram *program;
  string fragmentShaderSource;
  string vertexShaderSource;
  GLSLVersion glslVersion;
  undefined1 local_58 [8];
  string fragmentShaderTemplate;
  string vertexShaderTemplate;
  RenderBits renderBits_local;
  RenderContext *renderContext_local;
  
  gls::(anonymous_namespace)::generateVertexShaderTemplate_abi_cxx11_
            ((string *)((long)&fragmentShaderTemplate.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)renderBits,in_EDX);
  gls::(anonymous_namespace)::generateFragmentShaderTemplate_abi_cxx11_
            ((string *)local_58,(_anonymous_namespace_ *)(ulong)renderBits,renderBits_00);
  type.super_ApiType.m_bits = (ApiType)(*renderContext->_vptr_RenderContext[2])();
  glslVersion_00 = glu::getContextTypeGLSLVersion(type);
  specializeShader((string *)((long)&fragmentShaderSource.field_2 + 8),
                   (string *)((long)&fragmentShaderTemplate.field_2 + 8),glslVersion_00);
  specializeShader((string *)&program,(string *)local_58,glslVersion_00);
  this = (ShaderProgram *)operator_new(0xd0);
  glu::makeVtxFragSources
            (&local_188,(string *)((long)&fragmentShaderSource.field_2 + 8),(string *)&program);
  glu::ShaderProgram::ShaderProgram(this,renderContext,&local_188);
  glu::ProgramSources::~ProgramSources(&local_188);
  local_b8 = this;
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)(fragmentShaderSource.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
  return this;
}

Assistant:

glu::ShaderProgram* createRenderProgram (glu::RenderContext&	renderContext,
										 RenderBits				renderBits)
{
	const string				vertexShaderTemplate	= generateVertexShaderTemplate(renderBits);
	const string				fragmentShaderTemplate	= generateFragmentShaderTemplate(renderBits);

	const glu::GLSLVersion		glslVersion				= glu::getContextTypeGLSLVersion(renderContext.getType());

	const string				vertexShaderSource		= specializeShader(vertexShaderTemplate, glslVersion);
	const string				fragmentShaderSource	= specializeShader(fragmentShaderTemplate, glslVersion);

	glu::ShaderProgram* const	program					= new glu::ShaderProgram(renderContext, glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	return program;
}